

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

bool __thiscall
miniros::MasterLink::getParamImpl<bool>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map,bool cached)

{
  bool bVar1;
  mapped_type_conflict3 *pmVar2;
  _Rb_tree_node_base *p_Var3;
  RpcValue xml_value;
  RpcValue local_48;
  XmlRpcValue local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_48,cached);
  if (bVar1 && local_48._type == TypeStruct) {
    XmlRpc::XmlRpcValue::assertStruct(&local_48);
    p_Var3 = *(_Rb_tree_node_base **)&(local_48._value.asTime)->tm_wday;
    while( true ) {
      XmlRpc::XmlRpcValue::assertStruct(&local_48);
      bVar1 = p_Var3 == (_Rb_tree_node_base *)&(local_48._value.asTime)->tm_hour;
      if ((bVar1) || (2 < p_Var3[2]._M_color - _S_black)) break;
      local_38._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_38,(XmlRpcValue *)(p_Var3 + 2));
      bVar1 = xml_cast<bool>(&local_38);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](map,(key_type *)(p_Var3 + 1));
      *pmVar2 = bVar1;
      XmlRpc::XmlRpcValue::invalidate(&local_38);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_48);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}